

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::WallyUtil::ConvertEntropyToMnemonic
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,ByteData *entropy,string *language)

{
  words *w;
  CfdException *this;
  char *wally_string;
  int ret;
  string mnemonic_sentence;
  char *mnemonic_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy_bytes;
  int local_8c;
  undefined1 local_88 [32];
  WallyUtil *local_68;
  string local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  w = Bip39GetWordlist(language);
  ByteData::GetBytes(&local_40,entropy);
  local_68 = (WallyUtil *)0x0;
  local_8c = bip39_mnemonic_from_bytes
                       (w,local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(char **)&local_68);
  if (local_8c == 0) {
    ConvertStringAndFree_abi_cxx11_((string *)local_88,local_68,wally_string);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,&kMnemonicDelimiter,0x582901);
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__return_storage_ptr__,(string *)local_88,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_88._0_8_ = "cfdcore_wally_util.cpp";
  local_88._8_4_ = 0xef;
  local_88._16_8_ = "ConvertEntropyToMnemonic";
  logger::log<int&>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,
                    "Convert entropy to mnemonic error. ret=[{}]",&local_8c);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_88._0_8_ = local_88 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Convert entropy to mnemonic error.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_88);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<std::string> WallyUtil::ConvertEntropyToMnemonic(
    const ByteData& entropy, const std::string& language) {
  words* wally_wordlist = Bip39GetWordlist(language);

  std::vector<uint8_t> entropy_bytes = entropy.GetBytes();
  char* mnemonic_bytes = NULL;
  int ret = bip39_mnemonic_from_bytes(
      wally_wordlist, entropy_bytes.data(), entropy_bytes.size(),
      &mnemonic_bytes);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Convert entropy to mnemonic error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Convert entropy to mnemonic error.");
  }

  std::string mnemonic_sentence =
      WallyUtil::ConvertStringAndFree(mnemonic_bytes);
  std::vector<std::string> mnemonic =
      StringUtil::Split(mnemonic_sentence, kMnemonicDelimiter);

  return mnemonic;
}